

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O0

void __thiscall
MinVR::VRDatumSpecialized<std::vector<int,_std::allocator<int>_>,_(MinVR::VRCORETYPE_ID)4>::
VRDatumSpecialized(VRDatumSpecialized<std::vector<int,_std::allocator<int>_>,_(MinVR::VRCORETYPE_ID)4>
                   *this,vector<int,_std::allocator<int>_> *inVal)

{
  value_type *in_RSI;
  undefined8 *in_RDI;
  VRCORETYPE_ID_conflict in_stack_0000004c;
  VRDatum_conflict *in_stack_00000050;
  list<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  VRDatum::VRDatum(in_stack_00000050,in_stack_0000004c);
  *in_RDI = &PTR__VRDatumSpecialized_00179608;
  std::__cxx11::
  list<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::list((list<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *)0x1172a6);
  *(undefined1 *)(in_RDI + 0xc) = 0;
  *(undefined1 *)((long)in_RDI + 0x61) = 0;
  *(undefined4 *)((long)in_RDI + 100) = 1;
  std::__cxx11::
  list<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::push_front(in_stack_ffffffffffffffe0,in_RSI);
  return;
}

Assistant:

VRDatumSpecialized(const T inVal):
    VRDatum(TID), needPush(false), pushed(false), stackFrame(1) {
    value.push_front(inVal);
  }